

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

void __thiscall
sliced_chunk_iterator::sliced_chunk_iterator
          (sliced_chunk_iterator *this,comparer_context *ctx,long end)

{
  this->ctx = ctx;
  (this->current).first = 0;
  (this->current).second = 0;
  this->endit = false;
  this->next = 0x7fffffffffffffff;
  this->end = end;
  load_next(this);
  return;
}

Assistant:

sliced_chunk_iterator(comparer_context& ctx, long end)
        : ctx(ctx)
        , endit(false)
        , next(std::numeric_limits<long>::max())
        , end(end)
    {
        load_next();
    }